

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

bool boost::ext::ut::v1_1_8::utility::is_match(string_view input,string_view pattern)

{
  char cVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  size_type i;
  ulong __pos;
  basic_string_view<char,_std::char_traits<char>_> input_00;
  basic_string_view<char,_std::char_traits<char>_> pattern_00;
  string_view input_01;
  string_view pattern_01;
  string_view pattern_local;
  string_view input_local;
  
  pattern_local._M_str = pattern._M_str;
  pattern_local._M_len = pattern._M_len;
  pcVar5 = input._M_str;
  input_local._M_len = input._M_len;
  if (pattern_local._M_len == 0) {
    return input_local._M_len == 0;
  }
  cVar1 = *pattern_local._M_str;
  input_local._M_str = pcVar5;
  if (input_local._M_len == 0) {
    if (cVar1 != '*') {
      return false;
    }
    pattern_01 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&pattern_local,1,0xffffffffffffffff);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pcVar5;
    input_01 = (string_view)(auVar2 << 0x40);
  }
  else {
    if (cVar1 != '?') {
      if (cVar1 == '*') {
        __pos = 0;
        do {
          bVar4 = __pos <= input_local._M_len;
          if (input_local._M_len < __pos) {
            return bVar4;
          }
          input_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&input_local,__pos,0xffffffffffffffff);
          pattern_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 (&pattern_local,1,0xffffffffffffffff);
          bVar3 = is_match(input_00,pattern_00);
          __pos = __pos + 1;
        } while (!bVar3);
        return bVar4;
      }
      if (cVar1 != *pcVar5) {
        return false;
      }
    }
    input_01 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&input_local,1,0xffffffffffffffff);
    pattern_01 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&pattern_local,1,0xffffffffffffffff);
  }
  bVar4 = is_match(input_01,pattern_01);
  return bVar4;
}

Assistant:

[[nodiscard]] inline auto is_match(std::string_view input,
                                     std::string_view pattern) -> bool {
    if (std::empty(pattern)) {
      return std::empty(input);
    }

    if (std::empty(input)) {
      return pattern[0] == '*' ? is_match(input, pattern.substr(1)) : false;
    }

    if (pattern[0] != '?' and pattern[0] != '*' and pattern[0] != input[0]) {
      return false;
    }

    if (pattern[0] == '*') {
      for (decltype(std::size(input)) i = 0u; i <= std::size(input); ++i) {
        if (is_match(input.substr(i), pattern.substr(1))) {
          return true;
        }
      }
      return false;
    }

    return is_match(input.substr(1), pattern.substr(1));
  }